

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_concat(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 extraout_RAX;
  undefined1 *puVar11;
  undefined8 uVar12;
  uint extraout_EDX;
  uint32_t uVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  undefined1 *puVar18;
  bson_t *pbVar19;
  undefined1 *puVar20;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar21;
  bson_t bcon;
  bson_t expected;
  bson_t child2;
  bson_t child;
  undefined8 uStack_70d0;
  uint8_t *puStack_70c8;
  undefined1 *puStack_70c0;
  undefined1 auStack_70b0 [8];
  void *pvStack_70a8;
  undefined8 uStack_7098;
  undefined8 uStack_7090;
  char *pcStack_7088;
  undefined8 uStack_7070;
  undefined1 auStack_7000 [25944];
  void *pvStack_aa8;
  char *pcStack_aa0;
  char *pcStack_a98;
  char *pcStack_a90;
  code *pcStack_a88;
  bson_t bStack_a80;
  undefined1 auStack_a00 [4];
  uint uStack_9fc;
  undefined1 auStack_980 [336];
  void *pvStack_830;
  ulong uStack_828;
  undefined1 *puStack_820;
  ulong uStack_818;
  void *pvStack_810;
  code *pcStack_808;
  undefined1 auStack_800 [4];
  uint uStack_7fc;
  void *pvStack_6b0;
  undefined1 *puStack_6a8;
  ulong uStack_6a0;
  void *pvStack_698;
  ulong uStack_690;
  code *apcStack_688 [16];
  undefined8 uStack_608;
  undefined1 auStack_600 [4];
  uint uStack_5fc;
  undefined1 auStack_580 [4];
  uint uStack_57c;
  undefined1 auStack_500 [336];
  void *pvStack_3b0;
  undefined1 *puStack_3a8;
  undefined1 *puStack_3a0;
  char *pcStack_398;
  char *pcStack_390;
  code *apcStack_388 [16];
  undefined8 local_308;
  undefined1 local_300 [4];
  uint local_2fc;
  undefined1 local_280 [4];
  uint local_27c;
  undefined1 local_200 [128];
  undefined1 local_180 [336];
  
  apcStack_388[0] = (code *)0x13a518;
  bson_init(local_300);
  apcStack_388[0] = (code *)0x13a528;
  bson_init(local_280);
  apcStack_388[0] = (code *)0x13a538;
  bson_init(local_180);
  apcStack_388[0] = (code *)0x13a545;
  bson_init(local_200);
  puVar18 = (undefined1 *)0xffffffff;
  apcStack_388[0] = (code *)0x13a56c;
  bson_append_utf8(local_180,"hello",0xffffffff,"world",0xffffffff);
  apcStack_388[0] = (code *)0x13a586;
  bson_append_document(local_280,"foo",0xffffffff,local_180);
  apcStack_388[0] = (code *)0x13a58b;
  local_308 = bson_bcon_magic();
  apcStack_388[0] = (code *)0x0;
  pcStack_390 = "}";
  pcStack_398 = (char *)0x13a5bb;
  bcon_append(local_300,"foo","{",local_308,0x15,local_180);
  apcStack_388[0] = (code *)0x13a5c7;
  pvVar5 = (void *)bson_get_data(local_300);
  apcStack_388[0] = (code *)0x13a5d2;
  pvVar6 = (void *)bson_get_data(local_280);
  if (local_27c == local_2fc) {
    apcStack_388[0] = (code *)0x13a5f3;
    pvVar7 = (void *)bson_get_data(local_280);
    apcStack_388[0] = (code *)0x13a603;
    pvVar8 = (void *)bson_get_data(local_300);
    apcStack_388[0] = (code *)0x13a612;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)local_27c);
    if (iVar1 != 0) goto LAB_0013a7b2;
    apcStack_388[0] = (code *)0x13a627;
    bson_reinit(local_300);
    apcStack_388[0] = (code *)0x13a637;
    bson_reinit(local_280);
    apcStack_388[0] = (code *)0x13a647;
    bson_reinit(local_180);
    apcStack_388[0] = (code *)0x13a66b;
    bson_append_utf8(local_180,"0",0xffffffff,"bar",0xffffffff);
    apcStack_388[0] = (code *)0x13a68f;
    bson_append_utf8(local_180,"1",0xffffffff,"baz",0xffffffff);
    apcStack_388[0] = (code *)0x13a6a9;
    bson_append_array(local_280,"foo",0xffffffff,local_180);
    apcStack_388[0] = (code *)0x13a6ca;
    bson_append_utf8(local_200,"0",0xffffffff,"baz",0xffffffff);
    pcStack_390 = (char *)0x0;
    pcStack_398 = "]";
    puStack_3a8 = (undefined1 *)0x13a70c;
    puStack_3a0 = local_200;
    bcon_append(local_300,"foo","[","bar",local_308,0x15);
    apcStack_388[0] = (code *)0x13a71b;
    pvVar5 = (void *)bson_get_data(local_300);
    apcStack_388[0] = (code *)0x13a726;
    pvVar6 = (void *)bson_get_data(local_280);
    if (local_27c == local_2fc) {
      apcStack_388[0] = (code *)0x13a748;
      pvVar7 = (void *)bson_get_data(local_280);
      apcStack_388[0] = (code *)0x13a758;
      pvVar8 = (void *)bson_get_data(local_300);
      apcStack_388[0] = (code *)0x13a767;
      iVar1 = bcmp(pvVar7,pvVar8,(ulong)local_27c);
      if (iVar1 == 0) {
        apcStack_388[0] = (code *)0x13a77c;
        bson_destroy(local_300);
        apcStack_388[0] = (code *)0x13a789;
        bson_destroy(local_180);
        apcStack_388[0] = (code *)0x13a796;
        bson_destroy(local_200);
        apcStack_388[0] = (code *)0x13a7a3;
        bson_destroy(local_280);
        return;
      }
    }
    puVar18 = local_300;
    apcStack_388[0] = (code *)0x13a80c;
    uVar9 = bson_as_canonical_extended_json(puVar18,0);
    puVar20 = local_280;
    apcStack_388[0] = (code *)0x13a821;
    uVar10 = bson_as_canonical_extended_json(puVar20,0);
    uVar2 = local_27c;
    if (local_2fc < local_27c) {
      uVar2 = local_2fc;
    }
    uVar3 = local_27c;
    uVar4 = local_2fc;
    if (uVar2 != 0) {
      uVar2 = local_27c;
      if (local_2fc <= local_27c) {
        uVar2 = local_2fc;
      }
      uVar14 = 0;
      do {
        if (*(char *)((long)pvVar5 + uVar14) != *(char *)((long)pvVar6 + uVar14)) goto LAB_0013a944;
        uVar14 = uVar14 + 1;
      } while (uVar2 != (uint)uVar14);
    }
    uVar2 = 0xffffffff;
LAB_0013a946:
    if (uVar4 < uVar3) {
      uVar4 = uVar3;
    }
    uVar3 = uVar4 - 1;
    if (uVar2 != 0xffffffff) {
      uVar3 = uVar2;
    }
    apcStack_388[0] = (code *)0x13a971;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar9,uVar10);
    apcStack_388[0] = (code *)0x13a989;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar9 = (ulong)uVar3;
    apcStack_388[0] = (code *)0x13a9a4;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) goto LAB_0013aa07;
    puVar18 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013aa0c;
    puVar20 = (undefined1 *)(ulong)local_2fc;
    apcStack_388[0] = (code *)0x13a9c8;
    puVar11 = (undefined1 *)write(uVar3,pvVar5,(size_t)puVar20);
    if (puVar11 != puVar20) goto LAB_0013aa11;
    pvVar5 = (void *)(ulong)local_27c;
    apcStack_388[0] = (code *)0x13a9e3;
    pvVar7 = (void *)write(uVar4,pvVar6,(size_t)pvVar5);
    if (pvVar7 == pvVar5) {
      apcStack_388[0] = (code *)0x13a9f3;
      test_concat_cold_8();
      goto LAB_0013a9f3;
    }
  }
  else {
LAB_0013a7b2:
    apcStack_388[0] = (code *)0x13a7c4;
    local_308 = bson_as_canonical_extended_json(local_300,0);
    puVar20 = local_280;
    apcStack_388[0] = (code *)0x13a7db;
    uVar10 = bson_as_canonical_extended_json(puVar20,0);
    uVar3 = local_27c;
    if (local_2fc < local_27c) {
      uVar3 = local_2fc;
    }
    if (uVar3 != 0) {
      uVar3 = local_27c;
      if (local_2fc <= local_27c) {
        uVar3 = local_2fc;
      }
      uVar9 = 0;
      do {
        if (*(char *)((long)pvVar5 + uVar9) != *(char *)((long)pvVar6 + uVar9)) {
          puVar18 = (undefined1 *)(uVar9 & 0xffffffff);
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar3 != (uint)uVar9);
    }
    uVar3 = local_2fc;
    if (local_2fc < local_27c) {
      uVar3 = local_27c;
    }
    puVar11 = (undefined1 *)(ulong)(uVar3 - 1);
    if ((int)puVar18 != -1) {
      puVar11 = puVar18;
    }
    apcStack_388[0] = (code *)0x13a8b2;
    uVar12 = local_308;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",puVar11,local_308,uVar10);
    uVar3 = (uint)uVar12;
    apcStack_388[0] = (code *)0x13a8ca;
    uVar4 = open("failure.bad.bson",0x42,0x1a0);
    uVar9 = (ulong)uVar4;
    apcStack_388[0] = (code *)0x13a8e5;
    uVar2 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar4 == 0xffffffff) {
LAB_0013a9f3:
      apcStack_388[0] = (code *)0x13a9f8;
      test_concat_cold_5();
LAB_0013a9f8:
      apcStack_388[0] = (code *)0x13a9fd;
      test_concat_cold_4();
LAB_0013a9fd:
      apcStack_388[0] = (code *)0x13aa02;
      test_concat_cold_1();
    }
    else {
      puVar18 = (undefined1 *)(ulong)uVar2;
      if (uVar2 == 0xffffffff) goto LAB_0013a9f8;
      puVar20 = (undefined1 *)(ulong)local_2fc;
      apcStack_388[0] = (code *)0x13a911;
      puVar11 = (undefined1 *)write(uVar4,pvVar5,(size_t)puVar20);
      if (puVar11 != puVar20) goto LAB_0013a9fd;
      pvVar5 = (void *)(ulong)local_27c;
      apcStack_388[0] = (code *)0x13a930;
      pvVar7 = (void *)write(uVar2,pvVar6,(size_t)pvVar5);
      if (pvVar7 == pvVar5) {
        apcStack_388[0] = (code *)0x13a944;
        uVar14 = uVar9;
        test_concat_cold_3();
        uVar10 = extraout_RAX;
        uVar4 = extraout_EDX;
LAB_0013a944:
        uVar2 = (uint)uVar14;
        goto LAB_0013a946;
      }
    }
    apcStack_388[0] = (code *)0x13aa07;
    test_concat_cold_2();
LAB_0013aa07:
    apcStack_388[0] = (code *)0x13aa0c;
    test_concat_cold_10();
LAB_0013aa0c:
    apcStack_388[0] = (code *)0x13aa11;
    test_concat_cold_9();
LAB_0013aa11:
    apcStack_388[0] = (code *)0x13aa16;
    test_concat_cold_6();
  }
  apcStack_388[0] = test_iter;
  test_concat_cold_7();
  apcStack_688[0] = (code *)0x13aa43;
  pvStack_3b0 = pvVar6;
  puStack_3a8 = puVar18;
  puStack_3a0 = puVar20;
  pcStack_398 = (char *)pvVar5;
  pcStack_390 = (char *)uVar9;
  apcStack_388[0] = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_580);
  apcStack_688[0] = (code *)0x13aa53;
  bson_init(auStack_600);
  uVar9 = 0xffffffff;
  apcStack_688[0] = (code *)0x13aa75;
  bson_append_int32(auStack_600,"foo",0xffffffff,100);
  apcStack_688[0] = (code *)0x13aa8b;
  bson_iter_init_find(auStack_500,auStack_600,"foo");
  apcStack_688[0] = (code *)0x13aa90;
  uVar10 = bson_bcon_magic();
  apcStack_688[0] = (code *)0x13aaab;
  bcon_append(auStack_580,"foo",uVar10,0x1d,auStack_500,0);
  apcStack_688[0] = (code *)0x13aab3;
  pvVar5 = (void *)bson_get_data(auStack_580);
  apcStack_688[0] = (code *)0x13aabe;
  pvVar6 = (void *)bson_get_data(auStack_600);
  if (uStack_5fc == uStack_57c) {
    apcStack_688[0] = (code *)0x13aadc;
    pvVar7 = (void *)bson_get_data(auStack_600);
    apcStack_688[0] = (code *)0x13aaec;
    pvVar8 = (void *)bson_get_data(auStack_580);
    apcStack_688[0] = (code *)0x13aafb;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_5fc);
    if (iVar1 == 0) {
      apcStack_688[0] = (code *)0x13ab0c;
      bson_destroy(auStack_580);
      apcStack_688[0] = (code *)0x13ab19;
      bson_destroy(auStack_600);
      return;
    }
  }
  puVar18 = auStack_580;
  apcStack_688[0] = (code *)0x13ab3a;
  uStack_608 = bson_as_canonical_extended_json(puVar18,0);
  apcStack_688[0] = (code *)0x13ab51;
  uVar10 = bson_as_canonical_extended_json(auStack_600,0);
  uVar3 = uStack_5fc;
  if (uStack_57c < uStack_5fc) {
    uVar3 = uStack_57c;
  }
  if (uVar3 != 0) {
    uVar3 = uStack_5fc;
    if (uStack_57c <= uStack_5fc) {
      uVar3 = uStack_57c;
    }
    uVar14 = 0;
    do {
      if (*(char *)((long)pvVar5 + uVar14) != *(char *)((long)pvVar6 + uVar14)) {
        uVar9 = uVar14 & 0xffffffff;
        break;
      }
      uVar14 = uVar14 + 1;
    } while (uVar3 != (uint)uVar14);
  }
  uVar3 = uStack_57c;
  if (uStack_57c < uStack_5fc) {
    uVar3 = uStack_5fc;
  }
  uVar14 = (ulong)(uVar3 - 1);
  if ((int)uVar9 != -1) {
    uVar14 = uVar9;
  }
  apcStack_688[0] = (code *)0x13abc1;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14,uStack_608,uVar10);
  apcStack_688[0] = (code *)0x13abd9;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  apcStack_688[0] = (code *)0x13abf4;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar3 == 0xffffffff) {
LAB_0013ac43:
    apcStack_688[0] = (code *)0x13ac48;
    test_iter_cold_5();
LAB_0013ac48:
    apcStack_688[0] = (code *)0x13ac4d;
    test_iter_cold_4();
LAB_0013ac4d:
    apcStack_688[0] = (code *)0x13ac52;
    test_iter_cold_1();
  }
  else {
    puVar18 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013ac48;
    uVar9 = (ulong)uStack_57c;
    apcStack_688[0] = (code *)0x13ac18;
    uVar14 = write(uVar3,pvVar5,uVar9);
    if (uVar14 != uVar9) goto LAB_0013ac4d;
    pvVar5 = (void *)(ulong)uStack_5fc;
    apcStack_688[0] = (code *)0x13ac33;
    pvVar7 = (void *)write(uVar4,pvVar6,(size_t)pvVar5);
    if (pvVar7 == pvVar5) {
      apcStack_688[0] = (code *)0x13ac43;
      test_iter_cold_3();
      goto LAB_0013ac43;
    }
  }
  apcStack_688[0] = test_bcon_new;
  test_iter_cold_2();
  puVar20 = auStack_800;
  pcStack_808 = (code *)0x13ac7a;
  pvStack_6b0 = pvVar6;
  puStack_6a8 = puVar18;
  uStack_6a0 = uVar9;
  pvStack_698 = pvVar5;
  uStack_690 = (ulong)uVar3;
  apcStack_688[0] = (code *)apcStack_388;
  bson_init(auStack_800);
  pcStack_808 = (code *)0x13aca1;
  bson_append_utf8(auStack_800,"hello",0xffffffff,"world",0xffffffff);
  pcStack_808 = (code *)0x13acb2;
  uVar9 = bcon_new(0,"hello","world",0);
  pcStack_808 = (code *)0x13acbd;
  pvVar5 = (void *)bson_get_data(uVar9);
  pcStack_808 = (code *)0x13acc8;
  pvVar6 = (void *)bson_get_data(auStack_800);
  if (uStack_7fc == *(uint *)(uVar9 + 4)) {
    pcStack_808 = (code *)0x13ace1;
    pvVar7 = (void *)bson_get_data(auStack_800);
    pcStack_808 = (code *)0x13acec;
    pvVar8 = (void *)bson_get_data(uVar9);
    pcStack_808 = (code *)0x13acfc;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_7fc);
    if (iVar1 == 0) {
      pcStack_808 = (code *)0x13ad08;
      bson_destroy(uVar9);
      pcStack_808 = (code *)0x13ad10;
      bson_destroy(auStack_800);
      return;
    }
  }
  pcStack_808 = (code *)0x13ad29;
  uVar10 = bson_as_canonical_extended_json(uVar9,0);
  pcStack_808 = (code *)0x13ad39;
  uVar12 = bson_as_canonical_extended_json(auStack_800,0);
  uVar3 = *(uint *)(uVar9 + 4);
  uVar4 = uStack_7fc;
  if (uVar3 < uStack_7fc) {
    uVar4 = uVar3;
  }
  if (uVar4 != 0) {
    uVar4 = uStack_7fc;
    if (uVar3 <= uStack_7fc) {
      uVar4 = uVar3;
    }
    lVar15 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar15) != *(char *)((long)pvVar6 + lVar15)) {
        uVar4 = (uint)lVar15;
        goto LAB_0013ad71;
      }
      lVar15 = lVar15 + 1;
    } while (uVar4 != (uint)lVar15);
  }
  uVar4 = 0xffffffff;
LAB_0013ad71:
  if (uVar3 < uStack_7fc) {
    uVar3 = uStack_7fc;
  }
  uVar3 = uVar3 - 1;
  if (uVar4 != 0xffffffff) {
    uVar3 = uVar4;
  }
  pcStack_808 = (code *)0x13ad9c;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar10,uVar12);
  pcStack_808 = (code *)0x13adb4;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_808 = (code *)0x13adcf;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar3 == 0xffffffff) {
LAB_0013ae17:
    pcStack_808 = (code *)0x13ae1c;
    test_bcon_new_cold_5();
LAB_0013ae1c:
    pcStack_808 = (code *)0x13ae21;
    test_bcon_new_cold_4();
LAB_0013ae21:
    pcStack_808 = (code *)0x13ae26;
    test_bcon_new_cold_1();
  }
  else {
    puVar20 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013ae1c;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    pcStack_808 = (code *)0x13adef;
    uVar14 = write(uVar3,pvVar5,uVar9);
    if (uVar14 != uVar9) goto LAB_0013ae21;
    uVar9 = (ulong)uStack_7fc;
    pcStack_808 = (code *)0x13ae07;
    uVar14 = write(uVar4,pvVar6,uVar9);
    if (uVar14 == uVar9) {
      pcStack_808 = (code *)0x13ae17;
      test_bcon_new_cold_3();
      goto LAB_0013ae17;
    }
  }
  pcStack_808 = test_append_ctx;
  test_bcon_new_cold_2();
  pbVar19 = &bStack_a80;
  pcStack_a88 = (code *)0x13ae4b;
  pvStack_830 = pvVar6;
  uStack_828 = (ulong)uVar3;
  puStack_820 = puVar20;
  uStack_818 = uVar9;
  pvStack_810 = pvVar5;
  pcStack_808 = (code *)apcStack_688;
  bson_init(&bStack_a80);
  pcStack_a88 = (code *)0x13ae5b;
  bson_init(auStack_a00);
  pcStack_a88 = (code *)0x13ae6b;
  bson_init(auStack_980);
  pcStack_a88 = (code *)0x13ae8c;
  bson_append_utf8(auStack_980,"c",0xffffffff,"d",0xffffffff);
  pcStack_a88 = (code *)0x13aeb3;
  bson_append_utf8(auStack_980,"e",0xffffffff,"f",0xffffffff);
  pcStack_a88 = (code *)0x13aecd;
  bson_append_document(auStack_a00,"a",0xffffffff,auStack_980);
  pcVar17 = "e";
  pcStack_a90 = (char *)0x0;
  pcStack_a98 = "}";
  pcStack_aa0 = "f";
  pvStack_aa8 = (void *)0x13af02;
  test_append_ctx_helper(&bStack_a80,"a","{",0,"add magic");
  pcStack_a88 = (code *)0x13af11;
  pvVar5 = (void *)bson_get_data(&bStack_a80);
  pcStack_a88 = (code *)0x13af1c;
  pvVar6 = (void *)bson_get_data(auStack_a00);
  if (uStack_9fc == bStack_a80.len) {
    pcStack_a88 = (code *)0x13af3a;
    pvVar7 = (void *)bson_get_data(auStack_a00);
    pcStack_a88 = (code *)0x13af45;
    pvVar8 = (void *)bson_get_data(&bStack_a80);
    pcStack_a88 = (code *)0x13af54;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_9fc);
    if (iVar1 == 0) {
      pcStack_a88 = (code *)0x13af60;
      bson_destroy(&bStack_a80);
      pcStack_a88 = (code *)0x13af6d;
      bson_destroy(auStack_a00);
      pcStack_a88 = (code *)0x13af7a;
      bson_destroy(auStack_980);
      return;
    }
  }
  pcStack_a88 = (code *)0x13af96;
  uVar10 = bson_as_canonical_extended_json(&bStack_a80,0);
  pcStack_a88 = (code *)0x13afab;
  uVar12 = bson_as_canonical_extended_json(auStack_a00,0);
  uVar13 = uStack_9fc;
  if (bStack_a80.len < uStack_9fc) {
    uVar13 = bStack_a80.len;
  }
  if (uVar13 != 0) {
    uVar13 = uStack_9fc;
    if (bStack_a80.len <= uStack_9fc) {
      uVar13 = bStack_a80.len;
    }
    lVar15 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar15) != *(char *)((long)pvVar6 + lVar15)) {
        uVar3 = (uint)lVar15;
        goto LAB_0013afe4;
      }
      lVar15 = lVar15 + 1;
    } while (uVar13 != (uint)lVar15);
  }
  uVar3 = 0xffffffff;
LAB_0013afe4:
  uVar4 = bStack_a80.len;
  if (bStack_a80.len < uStack_9fc) {
    uVar4 = uStack_9fc;
  }
  uVar4 = uVar4 - 1;
  if (uVar3 != 0xffffffff) {
    uVar4 = uVar3;
  }
  pcStack_a88 = (code *)0x13b00f;
  uVar21 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar4);
  pcStack_a88 = (code *)0x13b027;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar16 = "failure.expected.bson";
  pvVar7 = (void *)0x42;
  pcStack_a88 = (code *)0x13b042;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar3 == 0xffffffff) {
LAB_0013b08e:
    pcStack_a88 = (code *)0x13b093;
    test_append_ctx_cold_5();
LAB_0013b093:
    pcStack_a88 = (code *)0x13b098;
    test_append_ctx_cold_4();
  }
  else {
    pbVar19 = (bson_t *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013b093;
    pcVar16 = (char *)(ulong)uVar3;
    pcStack_a88 = (code *)0x13b063;
    pvVar7 = pvVar5;
    uVar9 = write(uVar3,pvVar5,(ulong)bStack_a80.len);
    if (uVar9 == bStack_a80.len) {
      pvVar5 = (void *)(ulong)uStack_9fc;
      pcStack_a88 = (code *)0x13b07e;
      pvVar7 = pvVar6;
      pcVar16 = (char *)pbVar19;
      pvVar8 = (void *)write(uVar4,pvVar6,(size_t)pvVar5);
      if (pvVar8 != pvVar5) goto LAB_0013b09d;
      pvVar7 = (void *)(ulong)uVar4;
      pcStack_a88 = (code *)0x13b08e;
      pcVar16 = (char *)(ulong)uVar3;
      test_append_ctx_cold_3();
      goto LAB_0013b08e;
    }
  }
  pcStack_a88 = (code *)0x13b09d;
  test_append_ctx_cold_1();
LAB_0013b09d:
  pcStack_a88 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_70c0 = auStack_70b0;
  if (extraout_AL != '\0') {
    uStack_7070 = uVar21;
  }
  pvStack_70a8 = pvVar7;
  uStack_7098 = uVar10;
  uStack_7090 = uVar12;
  pcStack_7088 = pcVar17;
  pvStack_aa8 = pvVar6;
  pcStack_aa0 = (char *)pbVar19;
  pcStack_a98 = (char *)pvVar5;
  pcStack_a90 = (char *)(ulong)uVar3;
  pcStack_a88 = (code *)&pcStack_808;
  bcon_append_ctx_init(auStack_7000);
  puStack_70c8 = bStack_a80.padding;
  uStack_70d0 = 0x3000000008;
  bcon_append_ctx_va(pcVar16,auStack_7000,&uStack_70d0);
  if ((uint)uStack_70d0 < 0x29) {
    uStack_70d0 = CONCAT44(uStack_70d0._4_4_,(uint)uStack_70d0 + 8);
  }
  else {
    puStack_70c8 = puStack_70c8 + 8;
  }
  bcon_append_ctx(pcVar16,auStack_7000,"c","d",0);
  bcon_append_ctx_va(pcVar16,auStack_7000,&uStack_70d0);
  return;
}

Assistant:

static void
test_concat (void)
{
   bson_t bcon, expected, child, child2;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);
   bson_init (&child2);

   bson_append_utf8 (&child, "hello", -1, "world", -1);
   bson_append_document (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "{", BCON (&child), "}");

   bson_eq_bson (&bcon, &expected);

   bson_reinit (&bcon);
   bson_reinit (&expected);
   bson_reinit (&child);

   bson_append_utf8 (&child, "0", -1, "bar", -1);
   bson_append_utf8 (&child, "1", -1, "baz", -1);
   bson_append_array (&expected, "foo", -1, &child);

   bson_append_utf8 (&child2, "0", -1, "baz", -1);
   BCON_APPEND (&bcon, "foo", "[", "bar", BCON (&child2), "]");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&child);
   bson_destroy (&child2);
   bson_destroy (&expected);
}